

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

uint __thiscall
llvm::StringRef::edit_distance
          (StringRef *this,StringRef Other,bool AllowReplacements,uint MaxEditDistance)

{
  ArrayRef<char> FromArray;
  uint uVar1;
  
  FromArray.Data = this->Data;
  FromArray.Length = this->Length;
  uVar1 = ComputeEditDistance<char>
                    (FromArray,(ArrayRef<char>)Other,AllowReplacements,MaxEditDistance);
  return uVar1;
}

Assistant:

unsigned StringRef::edit_distance(llvm::StringRef Other,
                                  bool AllowReplacements,
                                  unsigned MaxEditDistance) const {
  return llvm::ComputeEditDistance(
      makeArrayRef(data(), size()),
      makeArrayRef(Other.data(), Other.size()),
      AllowReplacements, MaxEditDistance);
}